

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

bool __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>::insert_media
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *this,Media *media)

{
  pointer psVar1;
  pointer pSVar2;
  element_type *peVar3;
  MemorySlotHandler *pMVar4;
  __shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined8 uVar7;
  SCC *__args_1;
  long lVar8;
  DiskROM *this_00;
  ulong length;
  ulong uVar9;
  __shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  size_t drive;
  undefined1 local_60 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  psVar1 = (media->cartridges).
           super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (media->cartridges).
                super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar2 = (((psVar1->
               super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->segments_).
             super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __args_1 = (SCC *)cartridge_slot(this);
    MemorySlot::set_source((MemorySlot *)__args_1,&pSVar2->data);
    uVar9 = (long)(pSVar2->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            *(long *)&(pSVar2->data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
    length = 0x10000 - pSVar2->start_address;
    if (uVar9 <= length) {
      length = uVar9;
    }
    MemorySlot::map<(MSX::MemorySlot::AccessType)0>
              ((MemorySlot *)__args_1,0,(uint16_t)pSVar2->start_address,length);
    peVar3 = (((media->cartridges).
               super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar3 != (element_type *)0x0) &&
       (lVar8 = __dynamic_cast(peVar3,&Storage::Cartridge::Cartridge::typeinfo,
                               &Analyser::Static::MSX::Cartridge::typeinfo,0), lVar8 != 0)) {
      switch(*(undefined4 *)(lVar8 + 0x20)) {
      case 1:
        std::make_unique<MSX::Cartridge::KonamiROMSlotHandler,MSX::MemorySlot&>
                  ((MemorySlot *)local_60);
        break;
      case 2:
        std::make_unique<MSX::Cartridge::KonamiWithSCCROMSlotHandler,MSX::MemorySlot&,Konami::SCC&>
                  ((MemorySlot *)local_60,__args_1);
        break;
      case 3:
        std::make_unique<MSX::Cartridge::ASCII8kbROMSlotHandler,MSX::MemorySlot&>
                  ((MemorySlot *)local_60);
        break;
      case 4:
        std::make_unique<MSX::Cartridge::ASCII16kbROMSlotHandler,MSX::MemorySlot&>
                  ((MemorySlot *)local_60);
        break;
      default:
        goto switchD_0030e0c1_default;
      }
      uVar7 = local_60._0_8_;
      local_60._0_8_ = (MemorySlotHandler *)0x0;
      pMVar4 = this->memory_slots_[1].handler._M_t.
               super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
               ._M_t.
               super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
               .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl;
      this->memory_slots_[1].handler._M_t.
      super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>.
      _M_t.
      super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
      .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
           (MemorySlotHandler *)uVar7;
      if ((pMVar4 != (MemorySlotHandler *)0x0) &&
         ((*pMVar4->_vptr_MemorySlotHandler[1])(),
         (MemorySlotHandler *)local_60._0_8_ != (MemorySlotHandler *)0x0)) {
        (*(*(_func_int ***)local_60._0_8_)[1])();
      }
    }
  }
switchD_0030e0c1_default:
  p_Var5 = &((media->tapes).
             super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>;
  if (p_Var5 != &((media->tapes).
                  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>) {
    std::__shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x10),
               p_Var5);
    Storage::Tape::TapePlayer::set_tape
              (&(this->tape_player_).super_TapePlayer,
               (shared_ptr<Storage::Tape::Tape> *)(local_60 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  }
  local_60._8_8_ = this;
  if (((media->disks).
       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (media->disks).
       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (this_00 = disk_handler(this), this_00 != (DiskROM *)0x0)) {
    p_Var10 = &((media->disks).
                super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>;
    p_Var6 = &((media->disks).
               super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>;
    drive = 0;
    do {
      if (p_Var10 == p_Var6) break;
      std::__shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,p_Var10);
      DiskROM::set_disk(this_00,(shared_ptr<Storage::Disk::Disk> *)&local_40,drive);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      drive = drive + 1;
      p_Var10 = p_Var10 + 1;
    } while (drive != 2);
  }
  set_use_fast_tape((ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *)local_60._8_8_
                   );
  return true;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.cartridges.empty()) {
				const auto &segment = media.cartridges.front()->get_segments().front();
				auto &slot = cartridge_slot();

				slot.set_source(segment.data);
				slot.map(0, uint16_t(segment.start_address), std::min(segment.data.size(), 65536 - segment.start_address));

				auto msx_cartridge = dynamic_cast<Analyser::Static::MSX::Cartridge *>(media.cartridges.front().get());
				if(msx_cartridge) {
					switch(msx_cartridge->type) {
						default: break;
						case Analyser::Static::MSX::Cartridge::Konami:
							cartridge_primary().handler = std::make_unique<Cartridge::KonamiROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot));
						break;
						case Analyser::Static::MSX::Cartridge::KonamiWithSCC:
							cartridge_primary().handler = std::make_unique<Cartridge::KonamiWithSCCROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot), speaker_.scc);
						break;
						case Analyser::Static::MSX::Cartridge::ASCII8kb:
							cartridge_primary().handler = std::make_unique<Cartridge::ASCII8kbROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot));
						break;
						case Analyser::Static::MSX::Cartridge::ASCII16kb:
							cartridge_primary().handler = std::make_unique<Cartridge::ASCII16kbROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot));
						break;
					}
				}
			}

			if(!media.tapes.empty()) {
				tape_player_.set_tape(media.tapes.front());
			}

			if(!media.disks.empty()) {
				DiskROM *const handler = disk_handler();
				if(handler) {
					size_t drive = 0;
					for(auto &disk : media.disks) {
						handler->set_disk(disk, drive);
						drive++;
						if(drive == 2) break;
					}
				}
			}

			set_use_fast_tape();

			return true;
		}